

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O2

void sv_send_cb(uv_udp_send_t *req,int status)

{
  uv_udp_t *puVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if (req == (uv_udp_send_t *)0x0) {
    pcVar2 = "req != NULL";
    uStack_10 = 0x69;
  }
  else if (status == 0) {
    puVar1 = req->handle;
    if (puVar1 == &client || puVar1 == &server) {
      uv_close(puVar1,close_cb);
      free(req);
      sv_send_cb_called = sv_send_cb_called + 1;
      return;
    }
    pcVar2 = "(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client";
    uStack_10 = 0x6b;
  }
  else {
    pcVar2 = "status == 0";
    uStack_10 = 0x6a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-and-recv.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  uv_close((uv_handle_t*) req->handle, close_cb);
  free(req);

  sv_send_cb_called++;
}